

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall
GEO::Delaunay3d::locate(Delaunay3d *this,double *p,index_t hint,bool thread_safe,Sign *orient)

{
  uint t;
  pointer piVar1;
  double *pdVar2;
  bool bVar3;
  index_t lf;
  index_t iVar4;
  uint uVar5;
  int32 iVar6;
  uint uVar7;
  Sign SVar8;
  Sign *pSVar9;
  long lVar10;
  undefined7 in_register_00000009;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  double *pv [4];
  Sign orient_local [4];
  
  iVar4 = locate_inexact(this,p,hint,0x9c4);
  uVar14 = (ulong)iVar4;
  if ((int)CONCAT71(in_register_00000009,thread_safe) != 0) {
    Process::acquire_spinlock(&locate::lock);
  }
  while (iVar4 = (index_t)uVar14, iVar4 == 0xffffffff) {
    uVar5 = Numeric::random_int32();
    uVar14 = (ulong)uVar5 %
             (ulong)((uint)((ulong)((long)(this->cell_to_v_store_).
                                          super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                          .
                                          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->cell_to_v_store_).
                                         super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                         .
                                         super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) &
                    0x3fffffff);
    if (-1 < (int)(this->cell_next_).
                  super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                  super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14]) {
      uVar14 = 0xffffffff;
    }
  }
  bVar3 = tet_is_virtual(this,iVar4);
  if (bVar3) {
    lVar10 = 0;
    do {
      lVar11 = lVar10;
      if (lVar11 == 4) goto LAB_00159aff;
      lVar10 = lVar11 + 1;
    } while ((this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start[(ulong)(iVar4 * 4) + lVar11] != -1);
    uVar14 = (ulong)(uint)(this->cell_to_cell_store_).
                          super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                          super__Vector_impl_data._M_start[(ulong)(iVar4 * 4) + lVar11];
  }
LAB_00159aff:
  uVar13 = 0xffffffffffffffff;
  pSVar9 = orient_local;
  if (orient != (Sign *)0x0) {
    pSVar9 = orient;
  }
LAB_00159b15:
  uVar5 = (uint)uVar14;
  uVar15 = uVar5 * 4;
  piVar1 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->super_Delaunay).vertices_;
  iVar4 = (this->super_Delaunay).vertex_stride_;
  pv[0] = pdVar2 + piVar1[uVar15] * iVar4;
  pv[1] = pdVar2 + piVar1[(ulong)uVar15 + 1] * iVar4;
  pv[2] = pdVar2 + piVar1[(ulong)uVar15 + 2] * iVar4;
  pv[3] = pdVar2 + iVar4 * piVar1[(ulong)uVar15 + 3];
  iVar12 = 0;
  iVar6 = Numeric::random_int32();
  do {
    if (iVar12 == 4) {
      if (!thread_safe) {
        return uVar5;
      }
      locate::lock = '\0';
      return uVar5;
    }
    uVar7 = iVar6 + iVar12 & 3;
    t = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
        super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 | uVar15];
    if (t == 0xffffffff) {
      if (!thread_safe) {
        return 0xffffffff;
      }
      locate::lock = '\0';
      return 0xffffffff;
    }
    if (t == (uint)uVar13) {
      pSVar9[uVar7] = POSITIVE;
    }
    else {
      uVar13 = uVar13 & 0xffffffff;
      pdVar2 = pv[uVar7];
      pv[uVar7] = p;
      SVar8 = PCK::orient_3d(pv[0],pv[1],pv[2],pv[3]);
      pSVar9[uVar7] = SVar8;
      if (SVar8 == NEGATIVE) break;
      pv[uVar7] = pdVar2;
    }
    iVar12 = iVar12 + 1;
  } while( true );
  bVar3 = tet_is_virtual(this,t);
  uVar13 = uVar14;
  uVar14 = (ulong)t;
  if (bVar3) {
    if (thread_safe) {
      locate::lock = '\0';
    }
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      pSVar9[lVar10] = POSITIVE;
    }
    return t;
  }
  goto LAB_00159b15;
}

Assistant:

index_t Delaunay3d::locate(
        const double* p, index_t hint, bool thread_safe,
        Sign* orient
    ) const {

        //   Try improving the hint by using the 
        // inexact locate function. This gains
        // (a little bit) performance (a few 
        // percent in total Delaunay computation
        // time), but it is better than nothing...
        //   Note: there is a maximum number of tets 
        // traversed by locate_inexact()  (2500)
        // since there exists configurations in which
        // locate_inexact() loops forever !
        hint = locate_inexact(p, hint, 2500);

        static Process::spinlock lock = GEOGRAM_SPINLOCK_INIT;

        // We need to have this spinlock because
        // of random() that is not thread-safe
        // (TODO: implement a random() function with
        //  thread local storage)
        if(thread_safe) {
            Process::acquire_spinlock(lock);
        }

        // If no hint specified, find a tetrahedron randomly
        while(hint == NO_TETRAHEDRON) {
            hint = index_t(Numeric::random_int32()) % max_t();
            if(tet_is_free(hint)) {
                hint = NO_TETRAHEDRON;
            }
        }

        //  Always start from a real tet. If the tet is virtual,
        // find its real neighbor (always opposite to the
        // infinite vertex)
        if(tet_is_virtual(hint)) {
            for(index_t lf = 0; lf < 4; ++lf) {
                if(tet_vertex(hint, lf) == VERTEX_AT_INFINITY) {
                    hint = index_t(tet_adjacent(hint, lf));
                    geo_debug_assert(hint != NO_TETRAHEDRON);
                    break;
                }
            }
        }

        index_t t = hint;
        index_t t_pred = NO_TETRAHEDRON;
        Sign orient_local[4];
        if(orient == nullptr) {
            orient = orient_local;
        }


    still_walking:
        {
            const double* pv[4];
            pv[0] = vertex_ptr(finite_tet_vertex(t,0));
            pv[1] = vertex_ptr(finite_tet_vertex(t,1));
            pv[2] = vertex_ptr(finite_tet_vertex(t,2));
            pv[3] = vertex_ptr(finite_tet_vertex(t,3));
            
            // Start from a random facet
            index_t f0 = index_t(Numeric::random_int32()) % 4;
            for(index_t df = 0; df < 4; ++df) {
                index_t f = (f0 + df) % 4;
                
                signed_index_t s_t_next = tet_adjacent(t,f);

                //  If the opposite tet is -1, then it means that
                // we are trying to locate() (e.g. called from
                // nearest_vertex) within a tetrahedralization 
                // from which the infinite tets were removed.
                if(s_t_next == -1) {
                    if(thread_safe) {
                        Process::release_spinlock(lock);
                    }
                    return NO_TETRAHEDRON;
                }

                index_t t_next = index_t(s_t_next);

                //   If the candidate next tetrahedron is the
                // one we came from, then we know already that
                // the orientation is positive, thus we examine
                // the next candidate (or exit the loop if they
                // are exhausted).
                if(t_next == t_pred) {
                    orient[f] = POSITIVE ;
                    continue ; 
                }

                //   To test the orientation of p w.r.t. the facet f of
                // t, we replace vertex number f with p in t (same
                // convention as in CGAL).
                // This is equivalent to tet_facet_point_orient3d(t,f,p)
                // (but less costly, saves a couple of lookups)
                const double* pv_bkp = pv[f];
                pv[f] = p;
                orient[f] = PCK::orient_3d(pv[0], pv[1], pv[2], pv[3]);

                //   If the orientation is not negative, then we cannot
                // walk towards t_next, and examine the next candidate
                // (or exit the loop if they are exhausted).
                if(orient[f] != NEGATIVE) {
                    pv[f] = pv_bkp;
                    continue;
                }

                //  If the opposite tet is a virtual tet, then
                // the point has a positive orientation relative
                // to the facet on the border of the convex hull,
                // thus t_next is a tet in conflict and we are
                // done.
                if(tet_is_virtual(t_next)) {
                    if(thread_safe) {
                        Process::release_spinlock(lock);
                    }
                    for(index_t lf = 0; lf < 4; ++lf) {
                        orient[lf] = POSITIVE;
                    }
                    return t_next;
                }

                //   If we reach this point, then t_next is a valid
                // successor, thus we are still walking.
                t_pred = t;
                t = t_next;
                goto still_walking;
            }
        } 

        //   If we reach this point, we did not find a valid successor
        // for walking (a face for which p has negative orientation), 
        // thus we reached the tet for which p has all positive 
        // face orientations (i.e. the tet that contains p).

        if(thread_safe) {
            Process::release_spinlock(lock);
        }
        return t;
    }